

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_hd.c
# Opt level: O3

int nghttp2_hd_deflate_hd_bufs
              (nghttp2_hd_deflater *deflater,nghttp2_bufs *bufs,nghttp2_nv *nv,size_t nvlen)

{
  uint8_t *name;
  nghttp2_rcbuf *pnVar1;
  size_t __n;
  nghttp2_bufs *bufs_00;
  int iVar2;
  uint uVar3;
  int iVar4;
  size_t sVar5;
  ulong uVar6;
  byte *pbVar7;
  size_t sVar8;
  nghttp2_hd_entry *pnVar9;
  nghttp2_hd_entry *pnVar10;
  nghttp2_nv *nv_00;
  size_t sVar11;
  nghttp2_hd_entry *pnVar12;
  nghttp2_mem *pnVar13;
  ulong uVar14;
  uint32_t hash;
  uint8_t **ppuVar15;
  bool bVar16;
  nghttp2_hd_nv hd_nv;
  uint local_bc;
  nghttp2_hd_nv local_a8;
  ulong local_88;
  size_t local_80;
  nghttp2_bufs *local_78;
  nghttp2_nv *local_70;
  size_t local_68;
  nghttp2_mem *local_60;
  nghttp2_hd_map *local_58;
  size_t local_50;
  nghttp2_hd_nv local_48;
  
  if ((deflater->ctx).bad != '\0') {
    return -0x20b;
  }
  if (deflater->notify_table_size_change == '\0') {
LAB_0061e9b8:
    if (nvlen != 0) {
      local_58 = &deflater->map;
      sVar8 = 0;
      local_78 = bufs;
      local_70 = nv;
      local_68 = nvlen;
LAB_0061e9e0:
      nv_00 = nv + sVar8;
      pnVar13 = (deflater->ctx).mem;
      name = nv_00->name;
      sVar11 = nv_00->namelen;
      uVar3 = lookup_token(name,sVar11);
      if (uVar3 == 0xffffffff) {
        hash = 0x811c9dc5;
        if (sVar11 != 0) {
          sVar5 = 0;
          do {
            hash = (name[sVar5] ^ hash) * 0x1000193;
            sVar5 = sVar5 + 1;
          } while (sVar11 != sVar5);
          goto LAB_0061ea65;
        }
LAB_0061ea87:
        local_bc = 2;
        if (((nv_00->flags & 1) == 0) &&
           ((0x36 < uVar3 || (local_bc = 1, (0x40218208100008U >> ((ulong)uVar3 & 0x3f) & 1) == 0)))
           ) {
          local_bc = (uint)((deflater->ctx).hd_table_bufsize_max * 3 >> 2 <
                           nv_00->valuelen + sVar11 + 0x20);
        }
      }
      else {
        hash = 0;
        if (uVar3 < 0x3d) {
          hash = static_table[uVar3].hash;
        }
LAB_0061ea65:
        local_bc = 2;
        if ((uVar3 != 0x16) && ((uVar3 != 0x1f || (0x13 < nv_00->valuelen)))) goto LAB_0061ea87;
      }
      pnVar12 = local_58->table[hash & 0x7f];
      local_80 = sVar11;
      local_60 = pnVar13;
      local_50 = sVar8;
      if (pnVar12 == (nghttp2_hd_entry *)0x0) {
        uVar14 = 0xffffffffffffffff;
        if (0x3c < uVar3) goto LAB_0061ec35;
LAB_0061eba6:
        sVar8 = (size_t)uVar3;
        if (local_bc != 2) {
          iVar2 = uVar3 - 1;
          ppuVar15 = &static_table[sVar8].value.base;
          local_88 = sVar8;
          do {
            uVar14 = local_88;
            if (*(uint *)(ppuVar15 + 8) != uVar3) break;
            if ((ppuVar15[1] == (uint8_t *)nv_00->valuelen) &&
               (iVar4 = bcmp(*ppuVar15,nv_00->value,(size_t)ppuVar15[1]), iVar4 == 0))
            goto LAB_0061ed6b;
            sVar8 = sVar8 + 1;
            iVar2 = iVar2 + 1;
            ppuVar15 = ppuVar15 + 0x10;
            uVar14 = local_88;
          } while (iVar2 < 0x3c);
          goto LAB_0061ec35;
        }
LAB_0061ecfb:
        iVar2 = emit_indname_block(local_78,sVar8,nv_00,local_bc);
        nv = local_70;
        sVar11 = local_68;
        goto LAB_0061ed2e;
      }
      pnVar10 = (nghttp2_hd_entry *)0x0;
      do {
        if (((pnVar12->nv).token == uVar3) &&
           ((uVar3 != 0xffffffff ||
            (((pnVar12->hash == hash && (pnVar1 = (pnVar12->nv).name, pnVar1->len == sVar11)) &&
             (iVar2 = bcmp(pnVar1->base,name,local_80), sVar11 = local_80, iVar2 == 0)))))) {
          pnVar9 = pnVar10;
          if (pnVar10 == (nghttp2_hd_entry *)0x0) {
            pnVar9 = pnVar12;
          }
          if ((local_bc == 2) &&
             (bVar16 = pnVar10 == (nghttp2_hd_entry *)0x0, pnVar10 = pnVar12, bVar16)) break;
          pnVar1 = (pnVar12->nv).value;
          __n = pnVar1->len;
          pnVar10 = pnVar9;
          if ((__n == nv_00->valuelen) &&
             (iVar2 = bcmp(pnVar1->base,nv_00->value,__n), sVar11 = local_80, iVar2 == 0)) {
            sVar8 = (size_t)((deflater->ctx).next_seq + ~pnVar12->seq + 0x3d);
            goto LAB_0061ed6b;
          }
        }
        pnVar12 = pnVar12->next;
      } while (pnVar12 != (nghttp2_hd_entry *)0x0);
      if (uVar3 < 0x3d) goto LAB_0061eba6;
      if (pnVar10 == (nghttp2_hd_entry *)0x0) {
        uVar14 = 0xffffffffffffffff;
      }
      else {
        uVar14 = (ulong)((deflater->ctx).next_seq + ~pnVar10->seq + 0x3d);
      }
LAB_0061ec35:
      pnVar13 = local_60;
      sVar8 = uVar14;
      if (local_bc == 0) {
        local_88 = uVar14;
        if (uVar14 == 0xffffffffffffffff) {
          iVar2 = nghttp2_rcbuf_new2(&local_a8.name,name,local_80,local_60);
          if (iVar2 != 0) goto LAB_0061e9ae;
        }
        else {
          nghttp2_hd_table_get(&local_48,&deflater->ctx,uVar14);
          local_a8.name = local_48.name;
          nghttp2_rcbuf_incref(local_48.name);
          pnVar13 = local_60;
        }
        iVar2 = nghttp2_rcbuf_new2(&local_a8.value,nv_00->value,nv_00->valuelen,pnVar13);
        if (iVar2 != 0) {
          nghttp2_rcbuf_decref(local_a8.name);
          goto LAB_0061e9ae;
        }
        local_a8.flags = '\0';
        local_a8.token = uVar3;
        iVar2 = add_hd_table_incremental(&deflater->ctx,&local_a8,local_58,hash);
        nghttp2_rcbuf_decref(local_a8.value);
        nghttp2_rcbuf_decref(local_a8.name);
        sVar8 = local_88;
        if (iVar2 != 0) {
          iVar2 = -0x20b;
          goto LAB_0061e9ae;
        }
      }
      if (sVar8 != 0xffffffffffffffff) goto LAB_0061ecfb;
      iVar2 = emit_newname_block(local_78,nv_00,local_bc);
      nv = local_70;
      sVar11 = local_68;
LAB_0061ed2e:
      if (iVar2 != 0) goto LAB_0061e9ae;
      sVar8 = local_50 + 1;
      if (sVar8 == sVar11) goto LAB_0061ee4a;
      goto LAB_0061e9e0;
    }
LAB_0061ee4a:
    iVar2 = 0;
  }
  else {
    uVar14 = deflater->min_hd_table_bufsize_max;
    deflater->notify_table_size_change = '\0';
    deflater->min_hd_table_bufsize_max = 0xffffffff;
    uVar6 = (deflater->ctx).hd_table_bufsize_max;
    if (uVar14 < uVar6) {
      iVar2 = emit_table_size(bufs,uVar14);
      if (iVar2 == 0) {
        uVar6 = (deflater->ctx).hd_table_bufsize_max;
        goto LAB_0061e99d;
      }
    }
    else {
LAB_0061e99d:
      iVar2 = emit_table_size(bufs,uVar6);
      if (iVar2 == 0) goto LAB_0061e9b8;
    }
LAB_0061e9ae:
    (deflater->ctx).bad = '\x01';
  }
  return iVar2;
LAB_0061ed6b:
  sVar11 = local_68;
  nv = local_70;
  bufs_00 = local_78;
  if (sVar8 + 1 < 0x7f) {
    local_a8.name = (nghttp2_rcbuf *)(CONCAT71(local_a8.name._1_7_,(char)(sVar8 + 1)) | 0x80);
    sVar8 = 1;
  }
  else {
    uVar14 = sVar8 - 0x7e;
    if (uVar14 < 0x80) {
      sVar8 = 2;
      pbVar7 = (byte *)((long)&local_a8.name + 1);
    }
    else {
      uVar6 = uVar14;
      sVar8 = 2;
      do {
        sVar5 = sVar8;
        sVar8 = sVar5 + 1;
        bVar16 = 0x3fff < uVar6;
        uVar6 = uVar6 >> 7;
      } while (bVar16);
      iVar2 = -0x20b;
      if (0xe < sVar5 - 1) goto LAB_0061ed2e;
      pbVar7 = (byte *)((long)&local_a8.name + 1);
      uVar6 = uVar14;
      do {
        *pbVar7 = (byte)uVar6 | 0x80;
        uVar14 = uVar6 >> 7;
        pbVar7 = pbVar7 + 1;
        bVar16 = 0x3fff < uVar6;
        uVar6 = uVar14;
      } while (bVar16);
    }
    local_a8.name = (nghttp2_rcbuf *)CONCAT71(local_a8.name._1_7_,0xff);
    *pbVar7 = (byte)uVar14;
  }
  iVar2 = nghttp2_bufs_add(bufs_00,&local_a8,sVar8);
  goto LAB_0061ed2e;
}

Assistant:

int nghttp2_hd_deflate_hd_bufs(nghttp2_hd_deflater *deflater,
                               nghttp2_bufs *bufs, const nghttp2_nv *nv,
                               size_t nvlen) {
  size_t i;
  int rv = 0;

  if (deflater->ctx.bad) {
    return NGHTTP2_ERR_HEADER_COMP;
  }

  if (deflater->notify_table_size_change) {
    size_t min_hd_table_bufsize_max;

    min_hd_table_bufsize_max = deflater->min_hd_table_bufsize_max;

    deflater->notify_table_size_change = 0;
    deflater->min_hd_table_bufsize_max = UINT32_MAX;

    if (deflater->ctx.hd_table_bufsize_max > min_hd_table_bufsize_max) {

      rv = emit_table_size(bufs, min_hd_table_bufsize_max);

      if (rv != 0) {
        goto fail;
      }
    }

    rv = emit_table_size(bufs, deflater->ctx.hd_table_bufsize_max);

    if (rv != 0) {
      goto fail;
    }
  }

  for (i = 0; i < nvlen; ++i) {
    rv = deflate_nv(deflater, bufs, &nv[i]);
    if (rv != 0) {
      goto fail;
    }
  }

  DEBUGF("deflatehd: all input name/value pairs were deflated\n");

  return 0;
fail:
  DEBUGF("deflatehd: error return %d\n", rv);

  deflater->ctx.bad = 1;
  return rv;
}